

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryShaderRenderTest::GeometryShaderRenderTest
          (GeometryShaderRenderTest *this,Context *context,char *name,char *desc,
          GLenum inputPrimitives,GLenum outputPrimitives,char *dataAttributeName,int flags)

{
  GLenum outputPrimitives_local;
  GLenum inputPrimitives_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  GeometryShaderRenderTest *this_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShaderRenderTest_032ad810;
  this->m_numDrawVertices = 0;
  this->m_numDrawInstances = 0;
  this->m_vertexAttrDivisor = 0;
  this->m_inputPrimitives = inputPrimitives;
  this->m_outputPrimitives = outputPrimitives;
  this->m_dataAttributeName = dataAttributeName;
  this->m_flags = flags;
  tcu::Vector<int,_2>::Vector(&this->m_viewportSize,0x100,0x100);
  this->m_interationCount = 0;
  this->m_glResult = (Surface *)0x0;
  this->m_refResult = (Surface *)0x0;
  this->m_refBuffers = (ReferenceContextBuffers *)0x0;
  this->m_refContext = (ReferenceContext *)0x0;
  this->m_glContext = (Context *)0x0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&this->m_vertexPosData);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&this->m_vertexAttrData);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_indices);
  return;
}

Assistant:

GeometryShaderRenderTest::GeometryShaderRenderTest (Context& context, const char* name, const char* desc, GLenum inputPrimitives, GLenum outputPrimitives, const char* dataAttributeName, int flags)
	: TestCase				(context, name, desc)
	, m_numDrawVertices		(0)
	, m_numDrawInstances	(0)
	, m_vertexAttrDivisor	(0)
	, m_inputPrimitives		(inputPrimitives)
	, m_outputPrimitives	(outputPrimitives)
	, m_dataAttributeName	(dataAttributeName)
	, m_flags				(flags)
	, m_viewportSize		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE)
	, m_interationCount		(0)
	, m_glResult			(DE_NULL)
	, m_refResult			(DE_NULL)
	, m_refBuffers			(DE_NULL)
	, m_refContext			(DE_NULL)
	, m_glContext			(DE_NULL)
{
	// Disallow instanced drawElements
	DE_ASSERT(((m_flags & FLAG_DRAW_INSTANCED) == 0) || ((m_flags & FLAG_USE_INDICES) == 0));
	// Disallow restart without indices
	DE_ASSERT(!(((m_flags & FLAG_USE_RESTART_INDEX) != 0) && ((m_flags & FLAG_USE_INDICES) == 0)));
}